

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QPainterClipInfo>::moveAppend
          (QGenericArrayOps<QPainterClipInfo> *this,QPainterClipInfo *b,QPainterClipInfo *e)

{
  qsizetype *pqVar1;
  QPainterClipInfo *pQVar2;
  long lVar3;
  QRegionData *pQVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  undefined4 uVar9;
  Representation RVar10;
  Representation RVar11;
  Representation RVar12;
  long lVar13;
  QPainterClipInfo *pQVar14;
  QPainterClipInfo *pQVar15;
  byte bVar16;
  
  bVar16 = 0;
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QPainterClipInfo>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QPainterClipInfo>).size;
      pQVar2[lVar3].operation = b->operation;
      pQVar14 = b;
      pQVar15 = pQVar2 + lVar3;
      for (lVar13 = 0xb; lVar13 != 0; lVar13 = lVar13 + -1) {
        uVar9 = *(undefined4 *)&pQVar14->field_0x4;
        pQVar15->clipType = pQVar14->clipType;
        *(undefined4 *)&pQVar15->field_0x4 = uVar9;
        pQVar14 = (QPainterClipInfo *)((long)pQVar14 + (ulong)bVar16 * -0x10 + 8);
        pQVar15 = (QPainterClipInfo *)((long)pQVar15 + (ulong)bVar16 * -0x10 + 8);
      }
      QPainterPath::QPainterPath(&pQVar2[lVar3].path,&b->path);
      pQVar4 = (b->region).d;
      (b->region).d = &QRegion::shared_empty;
      pQVar2[lVar3].region.d = pQVar4;
      RVar10.m_i = (b->rect).y1.m_i;
      RVar11.m_i = (b->rect).x2.m_i;
      RVar12.m_i = (b->rect).y2.m_i;
      qVar5 = (b->rectf).xp;
      qVar6 = (b->rectf).yp;
      qVar7 = (b->rectf).w;
      qVar8 = (b->rectf).h;
      pQVar2[lVar3].rect.x1 = (Representation)(b->rect).x1.m_i;
      pQVar2[lVar3].rect.y1 = (Representation)RVar10.m_i;
      pQVar2[lVar3].rect.x2 = (Representation)RVar11.m_i;
      pQVar2[lVar3].rect.y2 = (Representation)RVar12.m_i;
      pQVar2[lVar3].rectf.xp = qVar5;
      pQVar2[lVar3].rectf.yp = qVar6;
      pQVar2[lVar3].rectf.w = qVar7;
      pQVar2[lVar3].rectf.h = qVar8;
      pqVar1 = &(this->super_QArrayDataPointer<QPainterClipInfo>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }